

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

int __thiscall
UnifiedRegex::CharSet<char16_t>::GetCompactEntries(CharSet<char16_t> *this,uint max,Char *entries)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined4 *puVar6;
  ulong uVar7;
  
  if (4 < max) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x589,"(max <= MaxCompact)","max <= MaxCompact");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  iVar5 = -1;
  if ((this->rep).compact.countPlusOne - 1 < 5) {
    uVar3 = *(int *)&this->rep - 1;
    if (max <= uVar3) {
      uVar3 = max;
    }
    if (uVar3 != 0) {
      uVar7 = 0;
      do {
        uVar4 = GetCompactCharU(this,(uint)uVar7);
        entries[uVar7] = (Char)uVar4;
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
    }
    iVar5 = *(int *)&this->rep + -1;
  }
  return iVar5;
}

Assistant:

int CharSet<char16>::GetCompactEntries(uint max, __out_ecount(max) Char* entries) const
    {
        Assert(max <= MaxCompact);
        if (!IsCompact())
            return -1;

        uint count = min(max, (uint)(this->GetCompactLength()));
        __analysis_assume(count <= max);
        for (uint i = 0; i < count; i++)
        {
            // Bug in oacr. it can't figure out count is less than or equal to max
#pragma warning(suppress: 22102)
            entries[i] = this->GetCompactChar(i);
        }
        return static_cast<int>(rep.compact.countPlusOne - 1);
    }